

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian16Fallback
          (CodedInputStream *this,uint16_t *value)

{
  bool bVar1;
  int iVar2;
  uint8_t *local_38;
  uint8_t *ptr;
  undefined8 uStack_28;
  uint8_t bytes [2];
  size_t kSize;
  uint16_t *value_local;
  CodedInputStream *this_local;
  
  uStack_28 = 2;
  iVar2 = BufferSize(this);
  if (iVar2 < 2) {
    bVar1 = ReadRaw(this,(void *)((long)&ptr + 6),2);
    if (!bVar1) {
      return false;
    }
    local_38 = (uint8_t *)((long)&ptr + 6);
  }
  else {
    local_38 = this->buffer_;
    Advance(this,2);
  }
  ReadLittleEndian16FromArray(local_38,value);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian16Fallback(uint16_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian16FromArray(ptr, value);
  return true;
}